

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

LBBox3fa * __thiscall
embree::avx512::PointsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,PointsISA *this,LinearSpace3fa *space,size_t primID,
          BBox1f *time_range)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t itime;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar24;
  undefined1 auVar23 [16];
  float fVar27;
  undefined1 auVar25 [16];
  float fVar28;
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  size_t local_c0;
  BBox<embree::Vec3fa> bi;
  anon_class_24_3_12c306ce local_90;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_90.primID = &local_c0;
  fVar1 = (this->super_Points).super_Geometry.fnumTimeSegments;
  fVar7 = (this->super_Points).super_Geometry.time_range.lower;
  fVar18 = (this->super_Points).super_Geometry.time_range.upper - fVar7;
  fVar14 = (time_range->lower - fVar7) / fVar18;
  fVar18 = (time_range->upper - fVar7) / fVar18;
  fVar7 = fVar1 * fVar14;
  auVar33 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),9);
  fVar9 = fVar1 * fVar18;
  auVar26 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),10);
  auVar23 = vmaxss_avx(auVar33,ZEXT816(0));
  auVar30 = vminss_avx(auVar26,ZEXT416((uint)fVar1));
  fVar8 = auVar23._0_4_;
  fVar19 = auVar30._0_4_;
  iVar5 = (int)auVar33._0_4_;
  iVar6 = -1;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  iVar4 = (int)fVar1 + 1;
  if ((int)auVar26._0_4_ < (int)fVar1 + 1) {
    iVar4 = (int)auVar26._0_4_;
  }
  local_c0 = primID;
  local_90.this = &this->super_Points;
  local_90.space = space;
  Points::linearBounds::anon_class_24_3_12c306ce::operator()(&blower0,&local_90,(long)(int)fVar8);
  Points::linearBounds::anon_class_24_3_12c306ce::operator()(&bupper1,&local_90,(long)(int)fVar19);
  if (iVar4 - iVar6 == 1) {
    auVar23 = vmaxss_avx(ZEXT416((uint)(fVar7 - fVar8)),ZEXT816(0) << 0x40);
    fVar7 = auVar23._0_4_;
    fVar1 = 1.0 - fVar7;
    auVar31._0_4_ = fVar7 * bupper1.lower.field_0._0_4_;
    auVar31._4_4_ = fVar7 * bupper1.lower.field_0._4_4_;
    auVar31._8_4_ = fVar7 * bupper1.lower.field_0._8_4_;
    auVar31._12_4_ = fVar7 * bupper1.lower.field_0._12_4_;
    auVar20._4_4_ = fVar1;
    auVar20._0_4_ = fVar1;
    auVar20._8_4_ = fVar1;
    auVar20._12_4_ = fVar1;
    aVar2.m128 = (__m128)vfmadd231ps_fma(auVar31,auVar20,blower0.lower.field_0);
    auVar10._0_4_ = fVar7 * bupper1.upper.field_0._0_4_;
    auVar10._4_4_ = fVar7 * bupper1.upper.field_0._4_4_;
    auVar10._8_4_ = fVar7 * bupper1.upper.field_0._8_4_;
    auVar10._12_4_ = fVar7 * bupper1.upper.field_0._12_4_;
    aVar3.m128 = (__m128)vfmadd231ps_fma(auVar10,blower0.upper.field_0,auVar20);
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar2;
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar3;
    auVar23 = vmaxss_avx(ZEXT416((uint)(fVar19 - fVar9)),ZEXT816(0) << 0x40);
    fVar7 = auVar23._0_4_;
    fVar1 = 1.0 - fVar7;
    auVar21._0_4_ = fVar7 * blower0.lower.field_0._0_4_;
    auVar21._4_4_ = fVar7 * blower0.lower.field_0._4_4_;
    auVar21._8_4_ = fVar7 * blower0.lower.field_0._8_4_;
    auVar21._12_4_ = fVar7 * blower0.lower.field_0._12_4_;
    auVar15._4_4_ = fVar1;
    auVar15._0_4_ = fVar1;
    auVar15._8_4_ = fVar1;
    auVar15._12_4_ = fVar1;
    aVar2.m128 = (__m128)vfmadd231ps_fma(auVar21,auVar15,bupper1.lower.field_0);
    auVar11._0_4_ = fVar7 * blower0.upper.field_0._0_4_;
    auVar11._4_4_ = fVar7 * blower0.upper.field_0._4_4_;
    auVar11._8_4_ = fVar7 * blower0.upper.field_0._8_4_;
    auVar11._12_4_ = fVar7 * blower0.upper.field_0._12_4_;
    aVar3.m128 = (__m128)vfmadd231ps_fma(auVar11,auVar15,bupper1.upper.field_0);
    (__return_storage_ptr__->bounds1).lower.field_0 = aVar2;
    (__return_storage_ptr__->bounds1).upper.field_0 = aVar3;
  }
  else {
    Points::linearBounds::anon_class_24_3_12c306ce::operator()
              (&blower1,&local_90,(long)((int)fVar8 + 1));
    Points::linearBounds::anon_class_24_3_12c306ce::operator()
              (&bupper0,&local_90,(long)((int)fVar19 + -1));
    auVar23 = vmaxss_avx(ZEXT416((uint)(fVar7 - fVar8)),ZEXT816(0) << 0x40);
    fVar8 = auVar23._0_4_;
    auVar29._0_4_ = fVar8 * blower1.lower.field_0.m128[0];
    auVar29._4_4_ = fVar8 * blower1.lower.field_0.m128[1];
    auVar29._8_4_ = fVar8 * blower1.lower.field_0.m128[2];
    auVar29._12_4_ = fVar8 * blower1.lower.field_0.m128[3];
    fVar7 = 1.0 - fVar8;
    auVar12._4_4_ = fVar7;
    auVar12._0_4_ = fVar7;
    auVar12._8_4_ = fVar7;
    auVar12._12_4_ = fVar7;
    auVar30 = vfmadd231ps_fma(auVar29,auVar12,(undefined1  [16])blower0.lower.field_0);
    auVar32._0_4_ = fVar8 * blower1.upper.field_0.m128[0];
    auVar32._4_4_ = fVar8 * blower1.upper.field_0.m128[1];
    auVar32._8_4_ = fVar8 * blower1.upper.field_0.m128[2];
    auVar32._12_4_ = fVar8 * blower1.upper.field_0.m128[3];
    auVar33 = vfmadd231ps_fma(auVar32,auVar12,(undefined1  [16])blower0.upper.field_0);
    auVar23 = vmaxss_avx(ZEXT416((uint)(fVar19 - fVar9)),ZEXT816(0) << 0x40);
    fVar9 = auVar23._0_4_;
    fVar7 = 1.0 - fVar9;
    auVar22._0_4_ = fVar9 * bupper0.lower.field_0.m128[0];
    auVar22._4_4_ = fVar9 * bupper0.lower.field_0.m128[1];
    auVar22._8_4_ = fVar9 * bupper0.lower.field_0.m128[2];
    auVar22._12_4_ = fVar9 * bupper0.lower.field_0.m128[3];
    auVar16._4_4_ = fVar7;
    auVar16._0_4_ = fVar7;
    auVar16._8_4_ = fVar7;
    auVar16._12_4_ = fVar7;
    auVar23 = vfmadd231ps_fma(auVar22,auVar16,(undefined1  [16])bupper1.lower.field_0);
    auVar25._0_4_ = fVar9 * bupper0.upper.field_0.m128[0];
    auVar25._4_4_ = fVar9 * bupper0.upper.field_0.m128[1];
    auVar25._8_4_ = fVar9 * bupper0.upper.field_0.m128[2];
    auVar25._12_4_ = fVar9 * bupper0.upper.field_0.m128[3];
    auVar26 = vfmadd231ps_fma(auVar25,auVar16,(undefined1  [16])bupper1.upper.field_0);
    iVar6 = -1;
    if (-1 < iVar5) {
      iVar6 = iVar5;
    }
    itime = (size_t)iVar6;
    while (itime = itime + 1, (long)itime < (long)iVar4) {
      fVar9 = ((float)(int)itime / fVar1 - fVar14) / (fVar18 - fVar14);
      fVar7 = 1.0 - fVar9;
      auVar34._0_4_ = auVar23._0_4_ * fVar9;
      fVar19 = auVar23._4_4_;
      auVar34._4_4_ = fVar19 * fVar9;
      fVar8 = auVar23._8_4_;
      auVar34._8_4_ = fVar8 * fVar9;
      fVar24 = auVar23._12_4_;
      auVar34._12_4_ = fVar24 * fVar9;
      auVar17._4_4_ = fVar7;
      auVar17._0_4_ = fVar7;
      auVar17._8_4_ = fVar7;
      auVar17._12_4_ = fVar7;
      auVar12 = vfmadd231ps_fma(auVar34,auVar17,auVar30);
      auVar13._0_4_ = auVar26._0_4_ * fVar9;
      fVar7 = auVar26._4_4_;
      auVar13._4_4_ = fVar7 * fVar9;
      fVar27 = auVar26._8_4_;
      auVar13._8_4_ = fVar27 * fVar9;
      fVar28 = auVar26._12_4_;
      auVar13._12_4_ = fVar28 * fVar9;
      auVar16 = vfmadd231ps_fma(auVar13,auVar33,auVar17);
      Points::linearBounds::anon_class_24_3_12c306ce::operator()(&bi,&local_90,itime);
      local_148 = auVar33._0_4_;
      fStack_144 = auVar33._4_4_;
      fStack_140 = auVar33._8_4_;
      fStack_13c = auVar33._12_4_;
      local_138 = auVar30._0_4_;
      fStack_134 = auVar30._4_4_;
      fStack_130 = auVar30._8_4_;
      fStack_12c = auVar30._12_4_;
      auVar30 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar12);
      auVar12 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar16);
      auVar33 = vminps_avx(auVar30,ZEXT816(0) << 0x40);
      auVar12 = vmaxps_avx(auVar12,ZEXT816(0) << 0x40);
      auVar30._0_4_ = local_138 + auVar33._0_4_;
      auVar30._4_4_ = fStack_134 + auVar33._4_4_;
      auVar30._8_4_ = fStack_130 + auVar33._8_4_;
      auVar30._12_4_ = fStack_12c + auVar33._12_4_;
      auVar23._0_4_ = auVar23._0_4_ + auVar33._0_4_;
      auVar23._4_4_ = fVar19 + auVar33._4_4_;
      auVar23._8_4_ = fVar8 + auVar33._8_4_;
      auVar23._12_4_ = fVar24 + auVar33._12_4_;
      auVar33._0_4_ = local_148 + auVar12._0_4_;
      auVar33._4_4_ = fStack_144 + auVar12._4_4_;
      auVar33._8_4_ = fStack_140 + auVar12._8_4_;
      auVar33._12_4_ = fStack_13c + auVar12._12_4_;
      auVar26._0_4_ = auVar26._0_4_ + auVar12._0_4_;
      auVar26._4_4_ = fVar7 + auVar12._4_4_;
      auVar26._8_4_ = fVar27 + auVar12._8_4_;
      auVar26._12_4_ = fVar28 + auVar12._12_4_;
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar30;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar33;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds1).lower.field_0.m128 = auVar23;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds1).upper.field_0.m128 = auVar26;
  }
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(const LinearSpace3fa& space, size_t primID, const BBox1f& time_range) const
      {
        return linearBounds(space, primID, time_range);
      }